

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

LocalFederateId __thiscall
helics::CommonCore::registerFederate(CommonCore *this,string_view name,CoreFederateInfo *info)

{
  uint uVar1;
  pointer pcVar2;
  pointer ppVar3;
  string_view message;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view name_00;
  pointer pMVar4;
  bool bVar5;
  FederateStates FVar6;
  IterationResult IVar7;
  int iVar8;
  size_type __n1;
  size_type sVar9;
  _Storage<unsigned_long,_true> _Var10;
  _Head_base<0UL,_helics::FederateState_*,_false> this_00;
  pointer puVar11;
  RegistrationFailure *pRVar12;
  pointer puVar13;
  char *pcVar14;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  pair<int,_int> *prop;
  pointer ppVar15;
  optional<unsigned_long> oVar16;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view message_05;
  string_view message_06;
  string_view message_07;
  string_view fmt;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string_view name_01;
  size_t sStackY_1c0;
  allocator<char> local_1a1;
  basic_string_view<char,_std::char_traits<char>_> local_1a0;
  allocator<char> local_189;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_188;
  mutex_type *local_180;
  BrokerBase *local_160;
  handle feds;
  string nname;
  ActionMessage reg;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_1a0._M_str = name._M_str;
  local_1a0._M_len = name._M_len;
  bVar5 = waitCoreRegistration(this);
  if (!bVar5) {
    if (((this->super_BrokerBase).brokerState._M_i == ERRORED) &&
       ((this->super_BrokerBase).lastErrorString._M_string_length != 0)) {
      pRVar12 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
      message_06._M_str = (this->super_BrokerBase).lastErrorString._M_dataplus._M_p;
      message_06._M_len = (this->super_BrokerBase).lastErrorString._M_string_length;
      RegistrationFailure::RegistrationFailure(pRVar12,message_06);
      __cxa_throw(pRVar12,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
    }
    pRVar12 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
    pcVar14 = "core is unable to register and has timed out, federate cannot be registered";
    sStackY_1c0 = 0x4b;
LAB_002853a5:
    message_04._M_str = pcVar14;
    message_04._M_len = sStackY_1c0;
    RegistrationFailure::RegistrationFailure(pRVar12,message_04);
    __cxa_throw(pRVar12,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
  }
  if ((INITIALIZING < (this->super_BrokerBase).brokerState._M_i) &&
     ((this->super_BrokerBase).dynamicFederation == false)) {
    pRVar12 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
    pcVar14 = "Core has already moved to operating state";
    sStackY_1c0 = 0x29;
    goto LAB_002853a5;
  }
  local_160 = &this->super_BrokerBase;
  __n1 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_1a0,"${",0);
  nname._M_dataplus._M_p = (pointer)&nname.field_2;
  nname._M_string_length = 0;
  nname.field_2._M_local_buf[0] = '\0';
  if (__n1 != 0xffffffffffffffff) {
    feds.data = (pointer)local_1a0._M_str;
    feds.m_handle_lock._M_device = (mutex_type *)local_1a0._M_len;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x9;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&feds;
    ::fmt::v11::vformat_abi_cxx11_((string *)&local_188,(v11 *)"rename:{}",fmt,args);
    in_R9 = local_188;
    (*(this->super_Core)._vptr_Core[0x5e])(&reg,this,4,"root",local_180,local_188.values_,0);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nname,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reg);
    std::__cxx11::string::~string((string *)&reg);
    std::__cxx11::string::~string((string *)&local_188);
    __x._M_str = local_1a0._M_str;
    __x._M_len = local_1a0._M_len;
    __y._M_str = nname._M_dataplus._M_p;
    __y._M_len = nname._M_string_length;
    bVar5 = std::operator==(__x,__y);
    if (!bVar5) {
      __str._M_str = nname._M_dataplus._M_p;
      __str._M_len = nname._M_string_length;
      iVar8 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_1a0,0,__n1,__str
                        );
      if (iVar8 != 0) {
        sVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(&nname,"error",0);
        if (sVar9 != 0xffffffffffffffff) {
          pRVar12 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
          message_07._M_str =
               "automatic naming resulting in failure, may not be supported by broker";
          message_07._M_len = 0x45;
          RegistrationFailure::RegistrationFailure(pRVar12,message_07);
          __cxa_throw(pRVar12,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
        }
      }
      pcVar2 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      sVar9 = (this->super_BrokerBase).identifier._M_string_length;
      reg._0_8_ = local_1a0._M_str;
      reg.source_id.gid = (undefined4)local_1a0._M_len;
      reg.source_handle.hid = local_1a0._M_len._4_4_;
      reg._16_8_ = nname._M_dataplus._M_p;
      reg.counter = (undefined2)nname._M_string_length;
      reg.flags = nname._M_string_length._2_2_;
      reg.sequenceID = nname._M_string_length._4_4_;
      fmt_00.size_ = 0xdd;
      fmt_00.data_ = (char *)0x1d;
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&reg;
      ::fmt::v11::vformat_abi_cxx11_
                ((string *)&local_188,(v11 *)"generated name for fed {}->{}",fmt_00,args_00);
      in_R9.values_ = (value<fmt::v11::context> *)0x0;
      message._M_str = (char *)local_188.values_;
      message._M_len = (size_t)local_180;
      name_01._M_str = pcVar2;
      name_01._M_len = sVar9;
      BrokerBase::sendToLogger(local_160,(GlobalFederateId)0x0,6,name_01,message,false);
      std::__cxx11::string::~string((string *)&local_188);
      local_1a0._M_len = nname._M_string_length;
      local_1a0._M_str = nname._M_dataplus._M_p;
    }
  }
  gmlc::libguarded::
  shared_guarded<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
  ::lock(&feds,&this->federates);
  pMVar4 = feds.data;
  if ((this->super_BrokerBase).maxFederateCount <=
      (int)((ulong)((long)((feds.data)->dataStorage).
                          super__Vector_base<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>,_std::allocator<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)((feds.data)->dataStorage).
                         super__Vector_base<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>,_std::allocator<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    pRVar12 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
    message_00._M_str = "maximum number of federates in the core has been reached";
    message_00._M_len = 0x38;
    RegistrationFailure::RegistrationFailure(pRVar12,message_00);
    __cxa_throw(pRVar12,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
  }
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&reg,(basic_string_view<char,_std::char_traits<char>_> *)&local_1a0,
             &local_1a1);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_188,(basic_string_view<char,_std::char_traits<char>_> *)&local_1a0,
             &local_189);
  oVar16 = gmlc::containers::MappedPointerVector<helics::FederateState,std::__cxx11::string>::
           insert<std::__cxx11::string,helics::CoreFederateInfo_const&>
                     ((MappedPointerVector<helics::FederateState,std::__cxx11::string> *)pMVar4,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reg,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_188,info);
  _Var10._M_value =
       oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&reg);
  pMVar4 = feds.data;
  if (((undefined1  [16])
       oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    if ((this->super_BrokerBase).dynamicFederation != true) {
      pRVar12 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
      local_188 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                  local_1a0._M_str;
      local_180 = (mutex_type *)local_1a0._M_len;
      fmt_02.size_ = 0xd;
      fmt_02.data_ = (char *)0x42;
      args_02.field_1.args_ = in_R9.args_;
      args_02.desc_ = (unsigned_long_long)&local_188;
      ::fmt::v11::vformat_abi_cxx11_
                ((string *)&reg,
                 (v11 *)"duplicate names {} detected: multiple federates with the same name",fmt_02,
                 args_02);
      message_05._M_str = (char *)reg._0_8_;
      message_05._M_len._0_4_ = reg.source_id.gid;
      message_05._M_len._4_4_ = reg.source_handle.hid;
      RegistrationFailure::RegistrationFailure(pRVar12,message_05);
      __cxa_throw(pRVar12,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
    }
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&reg,(basic_string_view<char,_std::char_traits<char>_> *)&local_1a0,
               (allocator<char> *)&local_188);
    this_00._M_head_impl =
         gmlc::containers::
         MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::find(pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reg);
    std::__cxx11::string::~string((string *)&reg);
    _Var10._M_value._4_4_ = 0;
    _Var10._M_value._0_4_ = ((LocalFederateId *)((long)this_00._M_head_impl + 0x28))->fid;
    bVar5 = FederateState::getOptionFlag(this_00._M_head_impl,0x26);
    if (!bVar5) {
LAB_002852bc:
      pRVar12 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
      local_188 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                  local_1a0._M_str;
      local_180 = (mutex_type *)local_1a0._M_len;
      fmt_01.size_ = 0xd;
      fmt_01.data_ = (char *)0x42;
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)&local_188;
      ::fmt::v11::vformat_abi_cxx11_
                ((string *)&reg,
                 (v11 *)"duplicate names {} detected: multiple federates with the same name",fmt_01,
                 args_01);
      message_02._M_str = (char *)reg._0_8_;
      message_02._M_len._0_4_ = reg.source_id.gid;
      message_02._M_len._4_4_ = reg.source_handle.hid;
      RegistrationFailure::RegistrationFailure(pRVar12,message_02);
      __cxa_throw(pRVar12,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
    }
    FVar6 = FederateState::getState(this_00._M_head_impl);
    if (FVar6 != FINISHED) goto LAB_002852bc;
    puVar11 = ((feds.data)->dataStorage).
              super__Vector_base<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>,_std::allocator<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar13 = ((feds.data)->dataStorage).
              super__Vector_base<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>,_std::allocator<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    puVar11 = ((feds.data)->dataStorage).
              super__Vector_base<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>,_std::allocator<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar13 = ((feds.data)->dataStorage).
              super__Vector_base<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>,_std::allocator<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)_Var10 < (ulong)((long)puVar13 - (long)puVar11 >> 3)) {
      this_00._M_head_impl =
           *(FederateState **)
            &puVar11[_Var10._M_value]._M_t.
             super___uniq_ptr_impl<helics::FederateState,_std::default_delete<helics::FederateState>_>
      ;
    }
    else {
      this_00._M_head_impl = (FederateState *)0x0;
    }
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&feds.m_handle_lock);
  if ((_Tuple_impl<0UL,_helics::FederateState_*,_std::default_delete<helics::FederateState>_>)
      this_00._M_head_impl == (FederateState *)0x0) {
    pRVar12 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
    message_01._M_str = "unknown allocation error occurred";
    message_01._M_len = 0x21;
    RegistrationFailure::RegistrationFailure(pRVar12,message_01);
    __cxa_throw(pRVar12,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
  }
  if (((undefined1  [16])
       oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    FederateState::reset(this_00._M_head_impl,info);
  }
  else {
    local_50._8_8_ = 0;
    local_38 = std::
               _Function_handler<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:775:24)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:775:24)>
               ::_M_manager;
    local_50._M_unused._M_object = this;
    FederateState::setLogger
              (this_00._M_head_impl,
               (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                *)&local_50);
    CLI::std::_Function_base::~_Function_base((_Function_base *)&local_50);
    ((LocalFederateId *)((long)this_00._M_head_impl + 0x28))->fid = (BaseType)_Var10._M_value;
    *(CommonCore **)((long)this_00._M_head_impl + 0x2a8) = this;
    if ((this->super_BrokerBase).enable_profiling == true) {
      FederateState::setOptionFlag(this_00._M_head_impl,0x5d,true);
    }
  }
  ActionMessage::ActionMessage(&reg,cmd_reg_fed);
  name_00._M_str = local_1a0._M_str;
  name_00._M_len = local_1a0._M_len;
  ActionMessage::name(&reg,name_00);
  if ((this->super_BrokerBase).observer == false) {
    bVar5 = FederateState::getOptionFlag(this_00._M_head_impl,0);
    if (!bVar5) goto LAB_00285160;
  }
  reg._24_8_ = reg._24_8_ | 0x1000000;
LAB_00285160:
  bVar5 = FederateState::getOptionFlag(this_00._M_head_impl,0x26);
  if (bVar5) {
    reg._24_8_ = reg._24_8_ | 0x4000000;
  }
  if (0 < *(int *)((long)this_00._M_head_impl + 0x298)) {
    reg.counter = (uint16_t)*(int *)((long)this_00._M_head_impl + 0x298);
  }
  BrokerBase::addActionMessage(local_160,&reg);
  if (((long)puVar13 - (long)puVar11 == 8 &
      oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged) != 0) {
    ppVar3 = (info->intProps).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (ppVar15 = (info->intProps).
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppVar15 != ppVar3;
        ppVar15 = ppVar15 + 1) {
      uVar1 = ppVar15->first - 0x10f;
      if ((uVar1 < 4) && (uVar1 != 2)) {
        setIntegerProperty(this,(LocalFederateId)0xfffffefd,ppVar15->first,(int16_t)ppVar15->second)
        ;
      }
    }
  }
  IVar7 = FederateState::waitSetup(this_00._M_head_impl);
  if (IVar7 == NEXT_STEP) {
    ActionMessage::~ActionMessage(&reg);
    std::__cxx11::string::~string((string *)&nname);
    return (LocalFederateId)(BaseType)_Var10._M_value;
  }
  pRVar12 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&feds,"fed received Failure ",&local_1a1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_188,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&feds,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)this_00._M_head_impl + 0x2b0));
  message_03._M_str = (char *)local_188.values_;
  message_03._M_len = (size_t)local_180;
  RegistrationFailure::RegistrationFailure(pRVar12,message_03);
  __cxa_throw(pRVar12,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
}

Assistant:

LocalFederateId CommonCore::registerFederate(std::string_view name, const CoreFederateInfo& info)
{
    if (!waitCoreRegistration()) {
        if (getBrokerState() == BrokerState::ERRORED) {
            if (!lastErrorString.empty()) {
                throw(RegistrationFailure(lastErrorString));
            }
        }
        throw(RegistrationFailure(
            "core is unable to register and has timed out, federate cannot be registered"));
    }
    if (getBrokerState() >= BrokerState::OPERATING) {
        if (!dynamicFederation) {
            throw(RegistrationFailure("Core has already moved to operating state"));
        }
    }
    auto iloc = name.find("${");
    std::string nname;
    if (iloc != std::string_view::npos) {
        /** this will block*/
        nname = query("root",
                      fmt::format("rename:{}", name),
                      HelicsSequencingModes::HELICS_SEQUENCING_MODE_FAST);
        if (name != nname) {
            if (name.compare(0, iloc, nname) != 0 && nname.find("error") != std::string::npos) {
                throw(RegistrationFailure(
                    "automatic naming resulting in failure, may not be supported by broker"));
            }
            sendToLogger(parent_broker_id,
                         HELICS_LOG_LEVEL_SUMMARY,
                         getIdentifier(),
                         fmt::format("generated name for fed {}->{}", name, nname));
            name = nname;
        }
    }
    FederateState* fed = nullptr;
    bool checkProperties{false};
    bool newFed{true};
    LocalFederateId local_id;
    {
        auto feds = federates.lock();
        if (static_cast<decltype(maxFederateCount)>(feds->size()) >= maxFederateCount) {
            throw(RegistrationFailure("maximum number of federates in the core has been reached"));
        }

        auto fedid = feds->insert(std::string(name), std::string(name), info);
        if (fedid) {
            local_id = LocalFederateId(static_cast<int32_t>(*fedid));
            fed = (*feds)[*fedid];
        } else {
            if (dynamicFederation) {
                fed = feds->find(std::string(name));
                local_id = fed->local_id;
                if (!fed->getOptionFlag(HELICS_FLAG_REENTRANT) ||
                    fed->getState() != FederateStates::FINISHED) {
                    throw(RegistrationFailure(fmt::format(
                        "duplicate names {} detected: multiple federates with the same name",
                        name)));
                }
                newFed = false;
            } else {
                throw(RegistrationFailure(fmt::format(
                    "duplicate names {} detected: multiple federates with the same name", name)));
            }
        }

        if (feds->size() == 1 && newFed) {
            checkProperties = true;
        }
    }
    if (fed == nullptr) {
        throw(RegistrationFailure("unknown allocation error occurred"));
    }
    if (newFed) {
        // setting up the Logger
        // auto ptr = fed.get();
        // if we are using the Logger, log all messages coming from the federates so they can
        // control the level*/
        fed->setLogger([this](int level, std::string_view ident, std::string_view message) {
            sendToLogger(parent_broker_id, LogLevels::FED + level, ident, message);
        });

        fed->local_id = local_id;
        fed->setParent(this);
        if (enable_profiling) {
            fed->setOptionFlag(defs::PROFILING, true);
        }
    } else {
        fed->reset(info);
    }
    ActionMessage reg(CMD_REG_FED);
    reg.name(name);
    if (observer || fed->getOptionFlag(HELICS_FLAG_OBSERVER)) {
        setActionFlag(reg, observer_flag);
    }
    if (fed->getOptionFlag(HELICS_FLAG_REENTRANT)) {
        setActionFlag(reg, reentrant_flag);
    }
    if (fed->indexGroup > 0) {
        reg.counter = static_cast<int16_t>(fed->indexGroup);
    }
    addActionMessage(reg);
    // check some properties that should be inherited from the federate if it is the first one
    if (checkProperties) {
        // if this is the first federate then the core should inherit the logging level properties
        for (const auto& prop : info.intProps) {
            switch (prop.first) {
                case defs::Properties::LOG_LEVEL:
                case defs::Properties::FILE_LOG_LEVEL:
                case defs::Properties::CONSOLE_LOG_LEVEL:
                    setIntegerProperty(gLocalCoreId, prop.first, static_cast<int16_t>(prop.second));
                    break;
                default:
                    break;
            }
        }
    }
    // now wait for the federateQueue to get the response
    auto valid = fed->waitSetup();
    if (valid == IterationResult::NEXT_STEP) {
        return local_id;
    }
    throw(RegistrationFailure(std::string("fed received Failure ") + fed->lastErrorString()));
}